

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O1

void __thiscall jpge::jpeg_encoder::emit_sof(jpeg_encoder *this)

{
  ulong uVar1;
  char cVar2;
  undefined1 uVar3;
  int iVar4;
  undefined8 in_RAX;
  ulong uVar5;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  emit_marker(this,0xc0);
  emit_word(this,(uint)this->m_num_components + (uint)this->m_num_components * 2 + 8);
  uStack_38._0_4_ = CONCAT13(8,(undefined3)uStack_38);
  if (this->m_all_stream_writes_succeeded == true) {
    iVar4 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 3,1);
    uVar3 = (undefined1)iVar4;
  }
  else {
    uVar3 = false;
  }
  this->m_all_stream_writes_succeeded = (bool)uVar3;
  emit_word(this,this->m_image_y);
  emit_word(this,this->m_image_x);
  uStack_38._0_5_ = CONCAT14(this->m_num_components,(undefined4)uStack_38);
  if (this->m_all_stream_writes_succeeded == true) {
    iVar4 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 4,1);
    uVar3 = (undefined1)iVar4;
  }
  else {
    uVar3 = false;
  }
  this->m_all_stream_writes_succeeded = (bool)uVar3;
  if (this->m_num_components != '\0') {
    uVar5 = 0;
    do {
      uVar1 = uVar5 + 1;
      uStack_38._0_6_ = CONCAT15((char)uVar1,(undefined5)uStack_38);
      if (this->m_all_stream_writes_succeeded == true) {
        iVar4 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 5,1);
        cVar2 = (char)iVar4;
      }
      else {
        cVar2 = false;
      }
      this->m_all_stream_writes_succeeded = (bool)cVar2;
      uStack_38._0_7_ =
           CONCAT16(this->m_comp_h_samp[uVar5] * '\x10' + this->m_comp_v_samp[uVar5],
                    (undefined6)uStack_38);
      if ((bool)cVar2 == false) {
        cVar2 = false;
      }
      else {
        iVar4 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 6,1);
        cVar2 = (char)iVar4;
      }
      this->m_all_stream_writes_succeeded = (bool)cVar2;
      uStack_38 = CONCAT17(uVar5 != 0,(undefined7)uStack_38);
      if ((bool)cVar2 == false) {
        uVar3 = false;
      }
      else {
        iVar4 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 7,1);
        uVar3 = (undefined1)iVar4;
      }
      this->m_all_stream_writes_succeeded = (bool)uVar3;
      uVar5 = uVar1;
    } while (uVar1 < this->m_num_components);
  }
  return;
}

Assistant:

void jpeg_encoder::emit_sof() {
  emit_marker(M_SOF0); /* baseline */
  emit_word(3 * m_num_components + 2 + 5 + 1);
  emit_byte(8); /* precision */
  emit_word(m_image_y);
  emit_word(m_image_x);
  emit_byte(m_num_components);
  for (int i = 0; i < m_num_components; i++) {
    emit_byte(static_cast<uint8>(i + 1));                  /* component ID     */
    emit_byte((m_comp_h_samp[i] << 4) + m_comp_v_samp[i]); /* h and v sampling */
    emit_byte(i > 0);                                      /* quant. table num */
  }
}